

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,rt_vector_expr<viennamath::rt_expression_interface<double>_> *e
                    )

{
  pointer prVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  
  poVar2 = std::operator<<(stream,"[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"](");
  lVar4 = 0;
  for (uVar3 = 1;
      prVar1 = (e->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 - 1 <
      (ulong)((long)(e->
                    super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ).
                    super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 3);
      uVar3 = uVar3 + 1) {
    operator<<(stream,(rt_expr<viennamath::rt_expression_interface<double>_> *)
                      ((long)&(prVar1->rt_expr_)._M_ptr + lVar4));
    if (uVar3 < (ulong)((long)(e->
                              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ).
                              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(e->
                              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ).
                              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      std::operator<<(stream,", ");
    }
    lVar4 = lVar4 + 8;
  }
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_vector_expr<InterfaceType> const & e)
  {
    stream << "[" << e.size() << "](";
    for (std::size_t i=0; i<e.size(); ++i)
    {
      stream << e[i];
      if (i+1 < e.size())
        stream << ", ";
    }
    stream << ")";

    return stream;
  }